

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write_char
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,char_type value)

{
  ulong uVar1;
  basic_buffer<char> *pbVar2;
  size_t sVar3;
  char_writer local_21;
  
  if (this->specs_ == (format_specs *)0x0) {
    pbVar2 = (this->writer_).out_.container;
    sVar3 = pbVar2->size_;
    uVar1 = sVar3 + 1;
    if (pbVar2->capacity_ < uVar1) {
      (**pbVar2->_vptr_basic_buffer)(pbVar2,uVar1);
    }
    pbVar2->size_ = uVar1;
    pbVar2->ptr_[sVar3] = value;
  }
  else {
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::char_writer>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               this,&this->specs_->super_align_spec,&local_21);
  }
  return;
}

Assistant:

void write_char(char_type value) {
    if (specs_)
      writer_.write_padded(*specs_, char_writer{value});
    else
      writer_.write(value);
  }